

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O3

void __thiscall
avro::detail::BufferImpl::writeTo<char>(BufferImpl *this,char val,true_type *param_2)

{
  _Elt_pointer pCVar1;
  char *pcVar2;
  data_type local_1;
  
  if ((this->freeSpace_ != 0) &&
     (pCVar1 = (this->writeChunks_).
               super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur, pcVar2 = pCVar1->writePos_,
     pCVar1->endPos_ != pcVar2)) {
    *pcVar2 = val;
    postWrite(this,1);
    return;
  }
  writeTo(this,&local_1,1);
  return;
}

Assistant:

void writeTo(T val, const boost::true_type&)
    {
        if(freeSpace_ && (sizeof(T) <= writeChunks_.front().freeSize())) {
            // fast path, there's enough room in the writeable chunk to just
            // straight out copy it
            *(reinterpret_cast <T*> ( writeChunks_.front().tellWritePos()) ) = val;
            postWrite(sizeof(T));
        }
        else {
            // need to fixup chunks first, so use the regular memcpy 
            // writeTo method
            writeTo(reinterpret_cast<data_type*>(&val), sizeof(T));
        }
    }